

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O2

size_t masked_vbyte_read_loop(uint8_t *in,uint32_t *out,int len_signed)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  uint32_t *out_00;
  uint64_t ints_read;
  ulong local_38;
  
  uVar4 = (ulong)len_signed;
  if ((uint)len_signed < 0x61) {
    uVar6 = 0;
    uVar8 = 0;
    uVar7 = 0;
    sVar9 = 0;
  }
  else {
    auVar3 = *(undefined1 (*) [32])in;
    auVar2 = *(undefined1 (*) [16])(in + 0x20);
    local_38 = (ulong)CONCAT24((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar2[0xf] >> 7) << 0xf,
                               (uint)(SUB321(auVar3 >> 7,0) & 1) |
                               (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f);
    lVar11 = 0x30;
    uVar8 = 0;
    uVar7 = 0;
    sVar9 = 0;
    do {
      auVar3 = *(undefined1 (*) [32])(in + lVar11);
      uVar6 = lVar11 - 0x10;
      uVar8 = uVar8 | local_38 << ((ulong)(byte)(((char)lVar11 - (char)sVar9) - 0x30) & 0x3f);
      auVar2 = *(undefined1 (*) [16])(in + lVar11 + 0x20);
      lVar11 = lVar11 + 0x30;
      local_38 = (ulong)CONCAT24((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar2[0xf] >> 7) << 0xf,
                                 (uint)(SUB321(auVar3 >> 7,0) & 1) |
                                 (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
                                 (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 |
                                 (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
                                 (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
                                 (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
                                 (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 |
                                 (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
                                 (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 |
                                 (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
                                 (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
                                 (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
                                 (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
                                 (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
                                 (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe |
                                 (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
                                 (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
                                 (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
                                 (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
                                 (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
                                 (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
                                 (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
                                 (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 |
                                 (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
                                 (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
                                 (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
                                 (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
                                 (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
                                 (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
                                 (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
                                 (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e |
                                 (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f);
      while (sVar9 < uVar6) {
        uVar5 = masked_vbyte_read_group(in + sVar9,out + uVar7,uVar8,&ints_read);
        uVar7 = uVar7 + ints_read;
        uVar8 = uVar8 >> (uVar5 & 0x3f);
        sVar9 = sVar9 + uVar5;
        if (uVar8 == 0xffffffffffffffff) {
          return 0;
        }
      }
    } while (uVar7 + 0x70 < uVar4);
    uVar10 = (int)lVar11 - (int)sVar9;
    uVar6 = (ulong)uVar10;
    uVar8 = local_38 << ((ulong)(uVar10 - 0x30) & 0x3f) | uVar8;
  }
  while( true ) {
    uVar10 = (uint)uVar6;
    lVar11 = (long)(int)uVar10;
    uVar1 = uVar7 + lVar11;
    if (uVar4 <= uVar1) break;
    if ((int)uVar10 < 0x10) {
      if (uVar1 + 0x1f < uVar4) {
        auVar3 = *(undefined1 (*) [32])(in + sVar9 + lVar11);
        uVar6 = (ulong)((uint)(SUB321(auVar3 >> 7,0) & 1) | (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1
                        | (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e |
                       (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f) << (uVar6 & 0x3f);
        uVar10 = uVar10 + 0x20;
      }
      else {
        if (uVar4 <= uVar1 + 0xf) break;
        auVar2 = vlddqu_avx(*(undefined1 (*) [16])(in + sVar9 + lVar11));
        uVar6 = (ulong)((uint)(ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) << (uVar10 & 0x1f));
        uVar10 = uVar10 + 0x10;
      }
      uVar8 = uVar8 | uVar6;
    }
    uVar5 = masked_vbyte_read_group(in + sVar9,out + uVar7,uVar8,&ints_read);
    uVar7 = uVar7 + ints_read;
    sVar9 = sVar9 + uVar5;
    uVar6 = (ulong)(uVar10 - (int)uVar5);
    uVar8 = uVar8 >> (uVar5 & 0x3f);
  }
  out_00 = out + uVar7;
  for (; uVar7 < uVar4; uVar7 = uVar7 + 1) {
    uVar10 = read_int(in + sVar9,out_00);
    sVar9 = sVar9 + uVar10;
    out_00 = out_00 + 1;
  }
  return sVar9;
}

Assistant:

size_t masked_vbyte_read_loop(const uint8_t *in, uint32_t *out,
                              int len_signed) {
  uint64_t length = (uint64_t)len_signed; // number of ints we want to decode
  size_t consumed = 0;                    // number of bytes read
  uint64_t count = 0; // how many integers we have read so far

  uint64_t sig = 0;
  int availablebytes = 0;
  if (96 < length) {
    size_t scanned = 0;

#ifdef __AVX2__
    __m256i low = _mm256_loadu_si256((__m256i *)(in + scanned));
    uint32_t lowSig = _mm256_movemask_epi8(low);
#else
    __m128i low1 = _mm_loadu_si128((__m128i *)(in + scanned));
    uint32_t lowSig1 = _mm_movemask_epi8(low1);
    __m128i low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
    uint32_t lowSig2 = _mm_movemask_epi8(low2);
    uint32_t lowSig = lowSig2 << 16;
    lowSig |= lowSig1;
#endif

    // excess verbosity to avoid problems with sign extension on conversions
    // better to think about what's happening and make it clearer
    __m128i high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
    uint32_t highSig = _mm_movemask_epi8(high);
    uint64_t nextSig = highSig;
    nextSig <<= 32;
    nextSig |= lowSig;
    scanned += 48;

    do {
      uint64_t thisSig = nextSig;

#ifdef __AVX2__
      low = _mm256_loadu_si256((__m256i *)(in + scanned));
      lowSig = _mm256_movemask_epi8(low);
#else
      low1 = _mm_loadu_si128((__m128i *)(in + scanned));
      lowSig1 = _mm_movemask_epi8(low1);
      low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
      lowSig2 = _mm_movemask_epi8(low2);
      lowSig = lowSig2 << 16;
      lowSig |= lowSig1;
#endif

      high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
      highSig = _mm_movemask_epi8(high);
      nextSig = highSig;
      nextSig <<= 32;
      nextSig |= lowSig;

      uint64_t remaining = scanned - (consumed + 48);
      sig = (thisSig << remaining) | sig;

      uint64_t reload = scanned - 16;
      scanned += 48;

      // need to reload when less than 16 scanned bytes remain in sig
      while (consumed < reload) {
        uint64_t ints_read;
        uint64_t bytes = masked_vbyte_read_group(in + consumed, out + count,
                                                 sig, &ints_read);
        sig >>= bytes;

        // seems like this might force the compiler to prioritize shifting sig
        // >>= bytes
        if (sig == 0xFFFFFFFFFFFFFFFF)
          return 0; // fake check to force earliest evaluation

        consumed += bytes;
        count += ints_read;
      }
    } while (count + 112 < length); // 112 == 48 + 48 ahead for scanning + up to
                                    // 16 remaining in sig
    sig = (nextSig << (scanned - consumed - 48)) | sig;
    availablebytes = (int)(scanned - consumed);
  }
  while (availablebytes + count < length) {
    if (availablebytes < 16) {
      if (availablebytes + count + 31 < length) {
#ifdef __AVX2__
        uint64_t newsigavx = (uint32_t)_mm256_movemask_epi8(
            _mm256_loadu_si256((__m256i *)(in + availablebytes + consumed)));
        sig |= (newsigavx << availablebytes);
#else
        uint64_t newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        uint64_t newsig2 = _mm_movemask_epi8(_mm_lddqu_si128(
            (const __m128i *)(in + availablebytes + 16 + consumed)));
        sig |= (newsig << availablebytes) | (newsig2 << (availablebytes + 16));
#endif
        availablebytes += 32;
      } else if (availablebytes + count + 15 < length) {
        int newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        sig |= newsig << availablebytes;
        availablebytes += 16;
      } else {
        break;
      }
    }
    uint64_t ints_read;

    uint64_t eaten =
        masked_vbyte_read_group(in + consumed, out + count, sig, &ints_read);
    consumed += eaten;
    availablebytes -= eaten;
    sig >>= eaten;
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}